

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalfd-test.c
# Opt level: O1

void * signalfd__multiple_readers_thread(void *arg)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  sigset_t mask;
  signalfd_siginfo fdsi;
  sigset_t local_110;
  undefined1 local_90 [128];
  
  iVar1 = sigemptyset(&local_110);
  if (iVar1 == 0) {
    iVar1 = sigaddset(&local_110,10);
    if (iVar1 == 0) {
      iVar1 = signalfd(-1,&local_110,0x800);
      if (iVar1 < 0) {
        piVar4 = __errno_location();
        microatf_fail_require
                  ("%s:%d: errno: %d",
                   "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
                   ,0x241,*piVar4);
      }
      iVar2 = pthread_barrier_wait((pthread_barrier_t *)arg);
      if (iVar2 + 1U < 2) {
        if (signalfd__multiple_readers_count == 0) {
          do {
            sVar3 = read(iVar1,local_90,0x80);
            if (sVar3 != 0x80) {
              if (sVar3 < 0) {
                piVar4 = __errno_location();
                if (*piVar4 == 0xb) goto LAB_00104849;
              }
              pcVar5 = "s == (ssize_t)sizeof(struct signalfd_siginfo) || (s < 0 && errno == EAGAIN)"
              ;
              uVar6 = 0x24c;
              goto LAB_00104889;
            }
            LOCK();
            signalfd__multiple_readers_count = signalfd__multiple_readers_count + 1;
            UNLOCK();
LAB_00104849:
          } while (signalfd__multiple_readers_count == 0);
        }
        iVar1 = close(iVar1);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        pcVar5 = "close(sfd) == 0";
        uVar6 = 0x252;
      }
      else {
        pcVar5 = "ec == 0 || ec == PTHREAD_BARRIER_SERIAL_THREAD";
        uVar6 = 0x245;
      }
    }
    else {
      pcVar5 = "sigaddset(&mask, SIGUSR1) == 0";
      uVar6 = 0x23f;
    }
  }
  else {
    pcVar5 = "sigemptyset(&mask) == 0";
    uVar6 = 0x23e;
  }
LAB_00104889:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/signalfd-test.c"
             ,uVar6,pcVar5);
}

Assistant:

static void *
signalfd__multiple_readers_thread(void *arg)
{
	pthread_barrier_t *barrier = arg;

	sigset_t mask;
	ATF_REQUIRE(sigemptyset(&mask) == 0);
	ATF_REQUIRE(sigaddset(&mask, SIGUSR1) == 0);
	int sfd = signalfd(-1, &mask, SFD_NONBLOCK);
	ATF_REQUIRE_MSG(sfd >= 0, "errno: %d", errno);

	{
		int ec = pthread_barrier_wait(barrier);
		ATF_REQUIRE(ec == 0 || ec == PTHREAD_BARRIER_SERIAL_THREAD);
	}

	while (signalfd__multiple_readers_count == 0) {
		struct signalfd_siginfo fdsi;
		ssize_t s = read(sfd, &fdsi, sizeof(struct signalfd_siginfo));
		ATF_REQUIRE(s == (ssize_t)sizeof(struct signalfd_siginfo) ||
		    (s < 0 && errno == EAGAIN));
		if (s == (ssize_t)sizeof(struct signalfd_siginfo)) {
			++signalfd__multiple_readers_count;
		}
	}

	ATF_REQUIRE(close(sfd) == 0);

	return NULL;
}